

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LU(TPZMatrix<std::complex<double>_> *this)

{
  complex<double> a;
  complex<double> *pcVar1;
  complex<double> *pcVar2;
  bool bVar3;
  int64_t iVar4;
  int64_t iVar5;
  TPZBaseMatrix *in_RDI;
  undefined8 uVar6;
  int64_t j;
  int64_t i;
  int64_t k;
  int64_t min;
  complex<double> pivot;
  complex<double> nn;
  char *in_stack_00000100;
  complex<double> *in_stack_fffffffffffffef8;
  complex<double> *in_stack_ffffffffffffff08;
  complex<double> *in_stack_ffffffffffffff10;
  int64_t local_e8;
  undefined1 local_a0 [16];
  complex<double> *local_90;
  undefined8 local_80;
  undefined8 local_70;
  complex<double> *local_68;
  undefined8 local_58;
  undefined8 local_48;
  complex<double> *local_40;
  int64_t local_38;
  complex<double> local_30;
  complex<double> local_20 [2];
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_00000100,(char *)this);
  }
  if (in_RDI->fDecomposed == '\0') {
    std::complex<double>::complex(local_20,0.0,0.0);
    uVar6 = 0;
    std::complex<double>::complex(&local_30,0.0,0.0);
    iVar4 = TPZBaseMatrix::Cols(in_RDI);
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar4 < iVar5) {
      local_e8 = TPZBaseMatrix::Cols(in_RDI);
    }
    else {
      local_e8 = TPZBaseMatrix::Rows(in_RDI);
    }
    local_38 = local_e8;
    for (local_40 = (complex<double> *)0x0; (long)local_40 < local_38;
        local_40 = (complex<double> *)(local_40->_M_value + 1)) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_40,local_40);
      a._M_value._8_8_ = in_stack_ffffffffffffff10;
      a._M_value._0_8_ = in_stack_ffffffffffffff08;
      local_58 = uVar6;
      local_48 = uVar6;
      local_30._M_value._8_8_ = uVar6;
      bVar3 = IsZero(a);
      pcVar1 = local_40;
      if (bVar3) {
        Error(in_stack_00000100,(char *)this);
        pcVar1 = local_40;
      }
      while( true ) {
        local_68 = (complex<double> *)(pcVar1->_M_value + 1);
        in_stack_ffffffffffffff10 = local_68;
        iVar4 = TPZBaseMatrix::Rows(in_RDI);
        if (iVar4 <= (long)in_stack_ffffffffffffff10) break;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_68,local_40);
        local_80 = uVar6;
        std::operator/(in_stack_fffffffffffffef8,(complex<double> *)0x12b7b44);
        local_70 = uVar6;
        local_20[0]._M_value._8_8_ = uVar6;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_68,local_40,local_20);
        local_90 = local_40;
        while( true ) {
          local_90 = (complex<double> *)(local_90->_M_value + 1);
          in_stack_ffffffffffffff08 = local_90;
          iVar4 = TPZBaseMatrix::Cols(in_RDI);
          pcVar2 = local_90;
          pcVar1 = local_68;
          if (iVar4 <= (long)in_stack_ffffffffffffff08) break;
          in_stack_fffffffffffffef8 = local_68;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_68,local_90);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_40,local_90);
          std::operator*(in_stack_fffffffffffffef8,(complex<double> *)0x12b7c48);
          std::operator-(in_stack_fffffffffffffef8,(complex<double> *)0x12b7c63);
          local_a0._8_8_ = uVar6;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,in_stack_fffffffffffffef8,pcVar2,local_a0);
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}